

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

Var * __thiscall jsonnet::internal::Desugarer::std(Desugarer *this)

{
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  Var *pVVar1;
  UString *in_stack_ffffffffffffff98;
  Desugarer *in_stack_ffffffffffffffa0;
  allocator<char32_t> *in_stack_ffffffffffffffd0;
  char32_t *in_stack_ffffffffffffffd8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffffe0;
  
  ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x21678f);
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  this_00 = &id(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)->name;
  pVVar1 = var((Desugarer *)this_00,(Identifier *)in_stack_ffffffffffffff98);
  ::std::__cxx11::u32string::~u32string(this_00);
  ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2167e4);
  return pVVar1;
}

Assistant:

Var *std(void)
    {
        // In most places, there is a "$std" variable inserted by
        // the desugarer. On the standard library itself there isn't,
        // so use "std" instead.
        return var(id(isStdlib ? U"std" : U"$std"));
    }